

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcsrc.cpp
# Opt level: O0

CTcSrcFile *
CTcSrcFile::open_source
          (char *filename,CResLoader *res_loader,char *default_charset,int *charset_error,
          int *default_charset_error)

{
  int iVar1;
  FILE *__stream;
  long __off;
  size_t sVar2;
  CTcSrcFile *pCVar3;
  undefined8 *puVar4;
  void *pvVar5;
  ulong uVar6;
  CCharmapToUni *pCVar7;
  undefined4 *in_RCX;
  long in_RDX;
  char *in_RDI;
  undefined4 *in_R8;
  bool bVar8;
  char *charset_name;
  size_t rem_2;
  char *p_2;
  size_t l;
  char **n;
  size_t rem_1;
  char *p_1;
  uint skip_1;
  int bige;
  char **cs_names;
  CTcSrcFile *srcf;
  uint skip;
  size_t rem;
  char *p;
  CCharmapToUni *mapper;
  long startofs;
  osfildef *fp;
  size_t siz;
  char buf [275];
  int in_stack_fffffffffffffd9c;
  CCharmapToUniASCII *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  osfildef *in_stack_fffffffffffffdb0;
  osfildef *in_stack_fffffffffffffdb8;
  CTcSrcFile *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffde0;
  void *in_stack_fffffffffffffde8;
  void *in_stack_fffffffffffffdf0;
  long local_1d8;
  char *local_1d0;
  char *in_stack_fffffffffffffe40;
  CResLoader *in_stack_fffffffffffffe48;
  undefined1 *local_1b0;
  uint local_1a8;
  char **local_1a0;
  CTcSrcFile *local_198;
  uint local_17c;
  ulong local_178;
  char *local_170;
  osfildef *local_168;
  char local_148;
  char local_147;
  char local_146;
  undefined1 auStack_145 [6];
  char local_13f [11];
  undefined1 auStack_134 [260];
  undefined4 *local_30;
  undefined4 *local_28;
  long local_20;
  CTcSrcFile *local_8;
  
  *in_RCX = 0;
  *in_R8 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  __stream = fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    local_8 = (CTcSrcFile *)0x0;
  }
  else {
    __off = ftell(__stream);
    sVar2 = fread(&local_148,1,0x113,__stream);
    if ((((sVar2 < 3) || (local_148 != -0x11)) || (local_147 != -0x45)) || (local_146 != -0x41)) {
      if (1 < sVar2) {
        local_198 = (CTcSrcFile *)0x0;
        if ((local_148 == -1) && (local_147 == -2)) {
          local_198 = (CTcSrcFile *)operator_new(0x430);
          pvVar5 = operator_new(0x210);
          memset(pvVar5,0,0x210);
          CCharmapToUniUcs2Little::CCharmapToUniUcs2Little
                    ((CCharmapToUniUcs2Little *)in_stack_fffffffffffffda0);
          CTcSrcFile(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (CCharmapToUni *)in_stack_fffffffffffffdb0);
          local_1a0 = open_source::names;
        }
        if ((local_148 == -2) && (local_147 == -1)) {
          local_198 = (CTcSrcFile *)operator_new(0x430);
          pvVar5 = operator_new(0x210);
          memset(pvVar5,0,0x210);
          CCharmapToUniUcs2Big::CCharmapToUniUcs2Big
                    ((CCharmapToUniUcs2Big *)in_stack_fffffffffffffda0);
          CTcSrcFile(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     (CCharmapToUni *)in_stack_fffffffffffffdb0);
          local_1a0 = open_source(char_const*,CResLoader*,char_const*,int*,int*)::names;
        }
        if (local_198 != (CTcSrcFile *)0x0) {
          local_1a8 = 2;
          iVar1 = ucs_str_starts_with((char *)in_stack_fffffffffffffdb8,
                                      (size_t)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                                      (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                      (int)in_stack_fffffffffffffda0);
          if (iVar1 != 0) {
            local_1b0 = auStack_134;
            uVar6 = sVar2 - 0x14;
            while( true ) {
              bVar8 = false;
              if (1 < uVar6) {
                iVar1 = ucs_char_eq(in_stack_fffffffffffffda8,
                                    (char)((ulong)in_stack_fffffffffffffda0 >> 0x38),
                                    (int)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
                bVar8 = true;
                if (iVar1 == 0) {
                  iVar1 = ucs_char_eq(in_stack_fffffffffffffda8,
                                      (char)((ulong)in_stack_fffffffffffffda0 >> 0x38),
                                      (int)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c);
                  bVar8 = iVar1 != 0;
                }
              }
              if (!bVar8) break;
              local_1b0 = local_1b0 + 2;
              uVar6 = uVar6 - 2;
            }
            if ((1 < uVar6) &&
               (iVar1 = ucs_char_eq(in_stack_fffffffffffffda8,
                                    (char)((ulong)in_stack_fffffffffffffda0 >> 0x38),
                                    (int)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c),
               iVar1 != 0)) {
              uVar6 = uVar6 - 2;
              for (; *local_1a0 != (char *)0x0; local_1a0 = local_1a0 + 1) {
                iVar1 = ucs_str_starts_with((char *)in_stack_fffffffffffffdb8,
                                            (size_t)in_stack_fffffffffffffdb0,
                                            in_stack_fffffffffffffda8,
                                            (int)((ulong)in_stack_fffffffffffffda0 >> 0x20),
                                            (int)in_stack_fffffffffffffda0);
                if (iVar1 != 0) {
                  sVar2 = strlen(*local_1a0);
                  if ((sVar2 * 2 + 2 <= uVar6) &&
                     (iVar1 = ucs_char_eq(in_stack_fffffffffffffda8,
                                          (char)((ulong)in_stack_fffffffffffffda0 >> 0x38),
                                          (int)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c),
                     iVar1 != 0)) {
                    local_1a8 = ((int)(sVar2 * 2) + (int)local_1b0 + 4) - (int)&local_148;
                    break;
                  }
                }
              }
            }
          }
          fseek(__stream,__off + (ulong)local_1a8,0);
          return local_198;
        }
      }
      if ((8 < sVar2) && (iVar1 = memcmp(&local_148,"#charset ",9), iVar1 == 0)) {
        local_1d0 = local_13f;
        local_1d8 = sVar2 - 9;
        while( true ) {
          bVar8 = false;
          if ((local_1d8 != 0) && (bVar8 = true, *local_1d0 != ' ')) {
            bVar8 = *local_1d0 == '\t';
          }
          if (!bVar8) break;
          local_1d0 = local_1d0 + 1;
          local_1d8 = local_1d8 + -1;
        }
        if ((local_1d8 != 0) && (*local_1d0 == '\"')) {
          do {
            local_1d0 = local_1d0 + 1;
            local_1d8 = local_1d8 + -1;
            bVar8 = false;
            if ((local_1d8 != 0) &&
               ((bVar8 = false, *local_1d0 != '\"' && (bVar8 = false, *local_1d0 != '\n')))) {
              bVar8 = *local_1d0 != '\r';
            }
          } while (bVar8);
          if ((local_1d8 != 0) && (*local_1d0 == '\"')) {
            fseek(__stream,(long)(local_1d0 + (__off - (long)&local_148) + 1),0);
            *local_1d0 = '\0';
            pCVar7 = CCharmapToUni::load(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
            if (pCVar7 != (CCharmapToUni *)0x0) {
              pCVar3 = (CTcSrcFile *)operator_new(0x430);
              CTcSrcFile(pCVar3,in_stack_fffffffffffffdb8,(CCharmapToUni *)in_stack_fffffffffffffdb0
                        );
              return pCVar3;
            }
            *local_28 = 1;
          }
        }
      }
      fseek(__stream,__off,0);
      if (local_20 == 0) {
        sVar2 = 0x210;
        in_stack_fffffffffffffdb0 = (osfildef *)operator_new(0x210);
        in_stack_fffffffffffffdb8 = in_stack_fffffffffffffdb0;
        memset(in_stack_fffffffffffffdb0,0,sVar2);
        CCharmapToUniASCII::CCharmapToUniASCII(in_stack_fffffffffffffda0);
        local_168 = in_stack_fffffffffffffdb0;
      }
      else {
        local_168 = (osfildef *)
                    CCharmapToUni::load(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      }
      if (local_168 == (osfildef *)0x0) {
        *local_30 = 1;
        fclose(__stream);
        local_8 = (CTcSrcFile *)0x0;
      }
      else {
        pCVar3 = (CTcSrcFile *)operator_new(0x430);
        CTcSrcFile(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                   (CCharmapToUni *)in_stack_fffffffffffffdb0);
        local_8 = pCVar3;
      }
    }
    else {
      local_17c = 3;
      if ((9 < sVar2 - 3) && (iVar1 = memcmp(auStack_145,"#charset ",9), iVar1 == 0)) {
        local_170 = local_13f + 3;
        local_178 = sVar2 - 0xc;
        while( true ) {
          bVar8 = false;
          if ((local_178 != 0) && (bVar8 = true, *local_170 != ' ')) {
            bVar8 = *local_170 == '\t';
          }
          if (!bVar8) break;
          local_170 = local_170 + 1;
          local_178 = local_178 - 1;
        }
        if ((local_178 < 7) ||
           (iVar1 = memicmp(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                            in_stack_fffffffffffffde0), iVar1 != 0)) {
          if ((5 < local_178) &&
             (iVar1 = memicmp(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                              in_stack_fffffffffffffde0), iVar1 == 0)) {
            local_17c = ((int)local_170 + 6) - (int)&local_148;
          }
        }
        else {
          local_17c = ((int)local_170 + 7) - (int)&local_148;
        }
      }
      fseek(__stream,__off + (ulong)local_17c,0);
      pCVar3 = (CTcSrcFile *)operator_new(0x430);
      puVar4 = (undefined8 *)operator_new(0x10);
      *puVar4 = 0;
      puVar4[1] = 0;
      CCharmapToUniUTF8::CCharmapToUniUTF8((CCharmapToUniUTF8 *)in_stack_fffffffffffffda0);
      CTcSrcFile(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (CCharmapToUni *)in_stack_fffffffffffffdb0);
      local_8 = pCVar3;
    }
  }
  return local_8;
}

Assistant:

CTcSrcFile *CTcSrcFile::open_source(const char *filename,
                                    class CResLoader *res_loader,
                                    const char *default_charset,
                                    int *charset_error,
                                    int *default_charset_error)
{
    char buf[275];
    size_t siz;
    osfildef *fp;
    long startofs;
    CCharmapToUni *mapper;

    /* presume we won't find an invalid #charset directive */
    *charset_error = FALSE;

    /* presume we'll have no problem with the default character set */
    *default_charset_error = FALSE;

    /* 
     *   open the file in binary mode, so that we can scan the first few
     *   bytes to see if we can detect the character set from information
     *   at the beginning of the file 
     */
    fp = osfoprb(filename, OSFTTEXT);

    /* if we couldn't open the file, return failure */
    if (fp == 0)
        return 0;

    /* note the starting offset in the file */
    startofs = osfpos(fp);

    /* read the first few bytes of the file */
    siz = osfrbc(fp, buf, sizeof(buf));

    /* check for a 3-byte UTF-8 byte-order marker */
    if (siz >= 3  && (uchar)buf[0] == 0xEF && (uchar)buf[1] == 0xBB
        && (uchar)buf[2] == 0xBF)
    {
        char *p;
        size_t rem;
        uint skip;

        /* skip at least the three-byte marker sequence */
        skip = 3;
        
        /* 
         *   check for a #charset marker for utf-8 - this would be redundant,
         *   but we'll allow it 
         */
        p = buf + 3;
        rem = siz - 3;
        if (rem > 9 && memcmp(p, "#charset ", 9) == 0)
        {
            /* skip spaces */
            for (p += 9, rem -= 9 ; rem != 0 && (*p == ' ' || *p == '\t') ;
                 ++p, --rem);

            /* check for valid character set markers */
            if (rem >= 7 && memicmp(p, "\"utf-8\"", 7) == 0)
            {
                /* skip the whole sequence */
                skip = (p + 7) - buf;
            }
            else if (rem >= 6 && memicmp(p, "\"utf8\"", 6) == 0)
            {
                /* skip the whole sequence */
                skip = (p + 6) - buf;
            }
        }

        /* seek past the character set markers */
        osfseek(fp, startofs + skip, OSFSK_SET);

        /* return a new utf-8 decoder */
        return new CTcSrcFile(fp, new CCharmapToUniUTF8());
    }

    /* if we read at least two bytes, try auto-detecting unicode */
    if (siz >= 2)
    {
        CTcSrcFile *srcf;
        const char *const *cs_names;
        int bige;

        /* presume we won't find a byte-order marker */
        srcf = 0;
        
        /* if the first bytes are 0xFF 0xFE, it's UCS-2 low-byte first */
        if ((unsigned char)buf[0] == 0xFF && (unsigned char)buf[1] == 0xFE)
        {
            static const char *names[] = { "unicodel", "utf-16le", 0 };

            /* create a UCS-2 little-endian reader */
            srcf = new CTcSrcFile(fp, new CCharmapToUniUcs2Little());
            bige = FALSE;
            cs_names = names;
        }

        /* if the first bytes are 0xFE 0xFF, it's UCS-2 high-byte first */
        if ((unsigned char)buf[0] == 0xFE && (unsigned char)buf[1] == 0xFF)
        {
            static const char *names[] = { "unicodeb", "utf-16be", 0 };

            /* create a UCS-2 little-endian reader */
            srcf = new CTcSrcFile(fp, new CCharmapToUniUcs2Big());
            bige = TRUE;
            cs_names = names;
        }

        /* if we found the byte-order marker, we know the character set */
        if (srcf != 0)
        {
            uint skip;

            /* we at least want to skip the byte-order marker */
            skip = 2;
            
            /* check to see if we have a '#charset' directive */
            if (ucs_str_starts_with(buf + 2, siz - 2, "#charset ",
                                    bige, FALSE))
            {
                char *p;
                size_t rem;
                
                /* scan past following spaces */
                for (p = buf + 2 + 18, rem = siz - 2 - 18 ;
                     rem >= 2 && (ucs_char_eq(p, ' ', bige, FALSE)
                                  || ucs_char_eq(p, '\t', bige, FALSE)) ;
                     p += 2, rem -= 2) ;

                /* check for a '"' */
                if (rem >= 2 && ucs_char_eq(p, '"', bige, FALSE))
                {
                    const char *const *n;

                    /* skip the '"' */
                    p += 2;
                    rem -= 2;
                    
                    /* 
                     *   check for a match to any of the valid names for this
                     *   character set 
                     */
                    for (n = cs_names ; *n != 0 ; ++n)
                    {
                        /* if it's a match, stop scanning */
                        if (ucs_str_starts_with(p, rem, *n, bige, TRUE))
                        {
                            size_t l;

                            /* get the length of the name */
                            l = strlen(*n) * 2;

                            /* check for a close quote */
                            if (rem >= l + 2
                                && ucs_char_eq(p + l, '"', bige, FALSE))
                            {
                                /* skip the name and the quote */
                                p += l + 2;
                                rem -= l + 2;

                                /* skip the source text to this point */
                                skip = p - buf;

                                /* stop scanning */
                                break;
                            }
                        }
                    }
                }
            }

            /* seek just past the character set indicators */
            osfseek(fp, startofs + skip, OSFSK_SET);

            /* return the file */
            return srcf;
        }
    }

    /*
     *   It doesn't appear to use UCS-2 encoding (at least, the file
     *   doesn't start with a byte-order sensing sequence).  Check to see
     *   if the file starts with "#charset " in ASCII single-byte
     *   characters.  
     */
    if (siz >= 9 && memcmp(buf, "#charset ", 9) == 0)
    {
        char *p;
        size_t rem;
        
        /* skip the #charset string and any following spaces */
        for (p = buf + 9, rem = siz - 9 ;
             rem > 0 && (*p == ' ' || *p == '\t') ; ++p, --rem) ;

        /* make sure we're looking at a '"' */
        if (rem != 0 && *p == '"')
        {
            char *charset_name;

            /* skip the open quote */
            ++p;
            --rem;
            
            /* remember where the character set name starts */
            charset_name = p;

            /* 
             *   find the closing quote, which must occur before a CR or
             *   LF character 
             */
            for ( ; rem > 0 && *p != '"' && *p != 10 && *p != 13 ;
                 ++p, --rem) ;

            /* make sure we found a matching quote */
            if (rem != 0 && *p == '"')
            {
                /* seek just past the #charset string */
                osfseek(fp, startofs + (p - buf) + 1, OSFSK_SET);

                /* 
                 *   put a null terminator at the end of the character set
                 *   name 
                 */
                *p = '\0';

                /* create a mapper */
                mapper = CCharmapToUni::load(res_loader, charset_name);

                /* 
                 *   if that succeeded, return a reader for the mapper;
                 *   otherwise, simply proceed as though no #charset had
                 *   been present, so that we create a default mapper 
                 */
                if (mapper != 0)
                {
                    /* success - return a reader */
                    return new CTcSrcFile(fp, mapper);
                }
                else
                {
                    /* tell the caller the #charset was invalid */
                    *charset_error = TRUE;
                }
            }
        }
    }

    /* 
     *   we didn't find any sensing codes, so seek back to the start of
     *   the file 
     */
    osfseek(fp, startofs, OSFSK_SET);

    /*
     *   We couldn't identify the file's character set based on anything
     *   in the file, so create a mapper for the given default character
     *   set.  If there's not even a default character set defined, create
     *   a plain ASCII mapper.  
     */
    if (default_charset != 0)
        mapper = CCharmapToUni::load(res_loader, default_charset);
    else
        mapper = new CCharmapToUniASCII();

    /* check to see if we created a mapper */
    if (mapper != 0)
    {
        /* return a source file reader based on the mapper */
        return new CTcSrcFile(fp, mapper);
    }
    else
    {
        /* 
         *   we failed to create a mapper for the default character set -
         *   flag the problem 
         */
        *default_charset_error = TRUE;

        /* close the input file */
        osfcls(fp);

        /* return failure */
        return 0;
    }
}